

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.cpp
# Opt level: O2

idx puppup::movegen::__impl::orthogonal(idx step,idx cursor,Gaddag *gaddag,State *state)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  idx iVar7;
  
  lVar4 = cursor + step;
  if (((state->board)._M_elems[lVar4] == 0x1b) &&
     (*(long *)((long)state + (cursor - step) * 8 + 8) == 0x1b)) {
    iVar7 = 0;
  }
  else {
    lVar3 = 0;
    lVar6 = *(long *)(board::letter_multiplier + cursor * 8) *
            (state->letter_score)._M_elems[cursor];
    lVar5 = (((gaddag->nodes_).
              super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
              ._M_impl.super__Vector_impl_data._M_start)->children)._M_elems
            [(state->board)._M_elems[cursor]];
    for (; (bVar2 = edge(lVar4), !bVar2 && (lVar1 = (state->board)._M_elems[lVar4], lVar1 != 0x1b));
        lVar4 = lVar4 + step) {
      lVar5 = (gaddag->nodes_).
              super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar5].children._M_elems[lVar1];
      if (lVar5 == -1) goto LAB_0010ca02;
      lVar6 = lVar6 + (state->letter_score)._M_elems[lVar4];
      lVar3 = lVar3 + -1;
    }
    lVar4 = (gaddag->nodes_).
            super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar5].children._M_elems[0x1f];
    if (lVar4 == -1) {
LAB_0010ca02:
      iVar7 = -1;
    }
    else {
      for (lVar5 = cursor - step;
          (bVar2 = edge(lVar5), !bVar2 && (lVar1 = (state->board)._M_elems[lVar5], lVar1 != 0x1b));
          lVar5 = lVar5 - step) {
        lVar4 = (gaddag->nodes_).
                super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar4].children._M_elems[lVar1];
        if (lVar4 == -1) goto LAB_0010ca02;
        lVar6 = lVar6 + (state->letter_score)._M_elems[lVar5];
        lVar3 = lVar3 + -1;
      }
      iVar7 = -1;
      if (((lVar3 == 0) ||
          ((gaddag->node_to_word_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start[lVar4] != -1)) &&
         (iVar7 = lVar6 * *(long *)(board::word_multiplier + cursor * 8), lVar3 == 0)) {
        iVar7 = 0;
      }
    }
  }
  return iVar7;
}

Assistant:

idx orthogonal(idx step, idx cursor, const trie::Gaddag& gaddag,
               const board::State& state) {
    if (state.board[cursor + step] == emptiness &&
        state.board[cursor - step] == emptiness) {
        return 0;
    }
    const idx orig_cursor = cursor;
    idx score = state.letter_score[cursor] * board::letter_multiplier[cursor];

    chr node = gaddag.get(0, state.board[cursor]);
    cursor += step;
    idx depth = 0;
    while (!edge(cursor) && state.board[cursor] != emptiness) {
        score += state.letter_score[cursor];
        if (!gaddag.has(node, state.board[cursor])) return -1;
        node = gaddag.get(node, state.board[cursor]);
        cursor += step;
        ++depth;
    }
    if (!gaddag.has(node, trie::rev_marker)) return -1;
    node = gaddag.get(node, trie::rev_marker);
    step = -step;
    cursor = orig_cursor + step;
    while (!edge(cursor) && state.board[cursor] != emptiness) {
        score += state.letter_score[cursor];
        if (!gaddag.has(node, state.board[cursor])) return -1;
        node = gaddag.get(node, state.board[cursor]);
        cursor += step;
        ++depth;
    }
    if (depth > 0 && !gaddag.exists(node)) return -1;
    score *= board::word_multiplier[orig_cursor];
    if (depth == 0) score = 0;
    return score;
}